

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_reader.hpp
# Opt level: O0

ReaderInitializeType __thiscall
duckdb::MultiFileReader::InitializeReader
          (MultiFileReader *this,MultiFileReaderData *reader_data,MultiFileBindData *bind_data,
          vector<duckdb::MultiFileColumnDefinition,_true> *global_columns,
          vector<duckdb::ColumnIndex,_true> *global_column_ids,
          optional_ptr<duckdb::TableFilterSet,_true> table_filters,ClientContext *context,
          optional_ptr<duckdb::MultiFileReaderGlobalState,_true> global_state)

{
  ReaderInitializeType RVar1;
  undefined8 in_RCX;
  long in_RDX;
  OpenFileInfo *this_00;
  undefined8 in_RSI;
  long *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  MultiFileList *in_stack_00000008;
  shared_ptr<duckdb::MultiFileList,_true> *in_stack_00000010;
  MultiFileList *this_01;
  undefined1 local_88 [48];
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_40;
  long local_38;
  undefined8 local_30;
  undefined8 local_18;
  
  this_01 = in_stack_00000008;
  local_48 = in_R8;
  local_40 = in_RCX;
  local_38 = in_RDX;
  local_30 = in_RSI;
  local_18 = in_R9;
  (**(code **)(*in_RDI + 0x50))(in_RDI,in_RSI,in_RDX + 0x98,in_RDX + 0x58,in_RCX,in_R8);
  local_58 = local_18;
  shared_ptr<duckdb::MultiFileList,_true>::operator->(in_stack_00000010);
  MultiFileList::GetFirstFile(this_01);
  this_00 = (OpenFileInfo *)(local_38 + 0x58);
  RVar1 = (**(code **)(*in_RDI + 0x58))
                    (in_RDI,in_stack_00000008,local_30,local_40,local_48,local_58,local_88,this_00,
                     local_38 + 0x160);
  OpenFileInfo::~OpenFileInfo(this_00);
  return RVar1;
}

Assistant:

virtual ReaderInitializeType InitializeReader(MultiFileReaderData &reader_data, const MultiFileBindData &bind_data,
	                                              const vector<MultiFileColumnDefinition> &global_columns,
	                                              const vector<ColumnIndex> &global_column_ids,
	                                              optional_ptr<TableFilterSet> table_filters, ClientContext &context,
	                                              optional_ptr<MultiFileReaderGlobalState> global_state) {
		FinalizeBind(reader_data, bind_data.file_options, bind_data.reader_bind, global_columns, global_column_ids,
		             context, global_state);
		return CreateMapping(context, reader_data, global_columns, global_column_ids, table_filters,
		                     bind_data.file_list->GetFirstFile(), bind_data.reader_bind, bind_data.virtual_columns);
	}